

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O0

bool dg::pta::usersImplyUnknown(PSNode *alloc)

{
  bool bVar1;
  PSNodeType PVar2;
  reference ppPVar3;
  long in_RDI;
  PSNode *user;
  const_iterator __end2;
  const_iterator __begin2;
  NodesVec *__range2;
  PSNode *in_stack_ffffffffffffffc8;
  PSNode *in_stack_ffffffffffffffd0;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_20;
  NodesVec *local_18;
  
  local_18 = SubgraphNode<dg::pta::PSNode>::getUsers((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
  local_20._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                  in_stack_ffffffffffffffc8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
             in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return true;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppPVar3;
    PVar2 = PSNode::getType(in_stack_ffffffffffffffd0);
    if ((PVar2 != LOAD) &&
       (bVar1 = isStoreOfUnknown(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_20);
  }
  return false;
}

Assistant:

static inline bool usersImplyUnknown(PSNode *alloc) {
    assert(alloc->getType() == PSNodeType::ALLOC);

    for (PSNode *user : alloc->getUsers()) {
        // we store only unknown to this memory
        // and the only other thing that we do is that
        // we load from it
        if ((user->getType() != PSNodeType::LOAD) &&
            // 'user' is not store of 'unknown' to 'nd'
            !isStoreOfUnknown(user, alloc))
            return false;
    }

    return true;
}